

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O0

int8_t __thiscall
I2Cdev::readBits(I2Cdev *this,uint16_t regAddr,uint8_t bitStart,uint8_t length,uint8_t *data,
                uint16_t timeout)

{
  uint uVar1;
  byte local_24 [2];
  uint16_t local_22;
  uint8_t mask;
  uint8_t b;
  uint8_t count;
  uint8_t *puStack_20;
  uint16_t timeout_local;
  uint8_t *data_local;
  uint8_t length_local;
  uint8_t bitStart_local;
  I2Cdev *pIStack_10;
  uint16_t regAddr_local;
  I2Cdev *this_local;
  
  local_22 = timeout;
  puStack_20 = data;
  data_local._4_1_ = length;
  data_local._5_1_ = bitStart;
  data_local._6_2_ = regAddr;
  pIStack_10 = this;
  uVar1 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x10])
                    (this,(ulong)regAddr,local_24,(ulong)timeout);
  if ((uVar1 & 0xff) != 0) {
    *puStack_20 = (uint8_t)((int)(uint)(local_24[0] &
                                       (byte)((1 << (data_local._4_1_ & 0x1f)) + -1 <<
                                             ((data_local._5_1_ - data_local._4_1_) + 1 & 0x1f))) >>
                           ((data_local._5_1_ - data_local._4_1_) + 1 & 0x1f));
  }
  return (int8_t)uVar1;
}

Assistant:

int8_t I2Cdev::readBits(uint16_t regAddr, uint8_t bitStart, uint8_t length, uint8_t *data, uint16_t timeout) {
    // 01101001 read byte
    // 76543210 bit numbers
    //    xxx   args: bitStart=4, length=3
    //    010   masked
    //   -> 010 shifted
    uint8_t count, b;
    if ((count = this->readByte(regAddr, &b, timeout)) != 0) {
        uint8_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        b &= mask;
        b >>= (bitStart - length + 1);
        *data = b;
    }
    return count;
}